

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_VERSION_3_2(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_VERSION_3_2 != 0) {
    glad_glDrawElementsBaseVertex =
         (PFNGLDRAWELEMENTSBASEVERTEXPROC)(*load)("glDrawElementsBaseVertex");
    glad_glDrawRangeElementsBaseVertex =
         (PFNGLDRAWRANGEELEMENTSBASEVERTEXPROC)(*load)("glDrawRangeElementsBaseVertex");
    glad_glDrawElementsInstancedBaseVertex =
         (PFNGLDRAWELEMENTSINSTANCEDBASEVERTEXPROC)(*load)("glDrawElementsInstancedBaseVertex");
    glad_glMultiDrawElementsBaseVertex =
         (PFNGLMULTIDRAWELEMENTSBASEVERTEXPROC)(*load)("glMultiDrawElementsBaseVertex");
    glad_glProvokingVertex = (PFNGLPROVOKINGVERTEXPROC)(*load)("glProvokingVertex");
    glad_glFenceSync = (PFNGLFENCESYNCPROC)(*load)("glFenceSync");
    glad_glIsSync = (PFNGLISSYNCPROC)(*load)("glIsSync");
    glad_glDeleteSync = (PFNGLDELETESYNCPROC)(*load)("glDeleteSync");
    glad_glClientWaitSync = (PFNGLCLIENTWAITSYNCPROC)(*load)("glClientWaitSync");
    glad_glWaitSync = (PFNGLWAITSYNCPROC)(*load)("glWaitSync");
    glad_glGetInteger64v = (PFNGLGETINTEGER64VPROC)(*load)("glGetInteger64v");
    glad_glGetSynciv = (PFNGLGETSYNCIVPROC)(*load)("glGetSynciv");
    glad_glGetInteger64i_v = (PFNGLGETINTEGER64I_VPROC)(*load)("glGetInteger64i_v");
    glad_glGetBufferParameteri64v =
         (PFNGLGETBUFFERPARAMETERI64VPROC)(*load)("glGetBufferParameteri64v");
    glad_glFramebufferTexture = (PFNGLFRAMEBUFFERTEXTUREPROC)(*load)("glFramebufferTexture");
    glad_glTexImage2DMultisample =
         (PFNGLTEXIMAGE2DMULTISAMPLEPROC)(*load)("glTexImage2DMultisample");
    glad_glTexImage3DMultisample =
         (PFNGLTEXIMAGE3DMULTISAMPLEPROC)(*load)("glTexImage3DMultisample");
    glad_glGetMultisamplefv = (PFNGLGETMULTISAMPLEFVPROC)(*load)("glGetMultisamplefv");
    glad_glSampleMaski = (PFNGLSAMPLEMASKIPROC)(*load)("glSampleMaski");
  }
  return;
}

Assistant:

static void load_GL_VERSION_3_2(GLADloadproc load) {
	if(!GLAD_GL_VERSION_3_2) return;
	glad_glDrawElementsBaseVertex = (PFNGLDRAWELEMENTSBASEVERTEXPROC)load("glDrawElementsBaseVertex");
	glad_glDrawRangeElementsBaseVertex = (PFNGLDRAWRANGEELEMENTSBASEVERTEXPROC)load("glDrawRangeElementsBaseVertex");
	glad_glDrawElementsInstancedBaseVertex = (PFNGLDRAWELEMENTSINSTANCEDBASEVERTEXPROC)load("glDrawElementsInstancedBaseVertex");
	glad_glMultiDrawElementsBaseVertex = (PFNGLMULTIDRAWELEMENTSBASEVERTEXPROC)load("glMultiDrawElementsBaseVertex");
	glad_glProvokingVertex = (PFNGLPROVOKINGVERTEXPROC)load("glProvokingVertex");
	glad_glFenceSync = (PFNGLFENCESYNCPROC)load("glFenceSync");
	glad_glIsSync = (PFNGLISSYNCPROC)load("glIsSync");
	glad_glDeleteSync = (PFNGLDELETESYNCPROC)load("glDeleteSync");
	glad_glClientWaitSync = (PFNGLCLIENTWAITSYNCPROC)load("glClientWaitSync");
	glad_glWaitSync = (PFNGLWAITSYNCPROC)load("glWaitSync");
	glad_glGetInteger64v = (PFNGLGETINTEGER64VPROC)load("glGetInteger64v");
	glad_glGetSynciv = (PFNGLGETSYNCIVPROC)load("glGetSynciv");
	glad_glGetInteger64i_v = (PFNGLGETINTEGER64I_VPROC)load("glGetInteger64i_v");
	glad_glGetBufferParameteri64v = (PFNGLGETBUFFERPARAMETERI64VPROC)load("glGetBufferParameteri64v");
	glad_glFramebufferTexture = (PFNGLFRAMEBUFFERTEXTUREPROC)load("glFramebufferTexture");
	glad_glTexImage2DMultisample = (PFNGLTEXIMAGE2DMULTISAMPLEPROC)load("glTexImage2DMultisample");
	glad_glTexImage3DMultisample = (PFNGLTEXIMAGE3DMULTISAMPLEPROC)load("glTexImage3DMultisample");
	glad_glGetMultisamplefv = (PFNGLGETMULTISAMPLEFVPROC)load("glGetMultisamplefv");
	glad_glSampleMaski = (PFNGLSAMPLEMASKIPROC)load("glSampleMaski");
}